

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter
          (ScopedFakeTestPartResultReporter *this)

{
  UnitTestImpl *this_00;
  UnitTestImpl *in_RDI;
  UnitTestImpl *impl;
  TestPartResultReporterInterface *in_stack_ffffffffffffffd8;
  
  in_RDI->_vptr_UnitTestImpl = (_func_int **)&PTR__ScopedFakeTestPartResultReporter_006e5f10;
  this_00 = internal::GetUnitTestImpl();
  if (*(int *)&in_RDI->parent_ == 1) {
    internal::UnitTestImpl::SetGlobalTestPartResultReporter
              (this_00,(TestPartResultReporterInterface *)this_00);
  }
  else {
    internal::UnitTestImpl::SetTestPartResultReporterForCurrentThread
              (in_RDI,in_stack_ffffffffffffffd8);
  }
  TestPartResultReporterInterface::~TestPartResultReporterInterface
            ((TestPartResultReporterInterface *)in_RDI);
  return;
}

Assistant:

ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    impl->SetGlobalTestPartResultReporter(old_reporter_);
  } else {
    impl->SetTestPartResultReporterForCurrentThread(old_reporter_);
  }
}